

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_tri_uv_bounding_sphere3(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *center,REF_DBL *radius)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  REF_INT sens;
  REF_DBL uv2 [2];
  REF_DBL uv1 [2];
  REF_DBL uv0 [2];
  
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,2,uv0,&sens);
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,2,uv1,&sens);
    if (uVar1 == 0) {
      uVar1 = ref_geom_cell_tuv(ref_geom,nodes[2],nodes,2,uv2,&sens);
      if (uVar1 == 0) {
        auVar6._0_8_ = uv0[0] + uv1[0] + uv2[0];
        auVar6._8_8_ = uv0[1] + uv1[1] + uv2[1];
        auVar6 = divpd(auVar6,_DAT_0020c760);
        *(undefined1 (*) [16])center = auVar6;
        *radius = 0.0;
        dVar4 = SQRT((uv0[1] - center[1]) * (uv0[1] - center[1]) +
                     (uv0[0] - *center) * (uv0[0] - *center));
        *radius = dVar4;
        dVar5 = SQRT((uv1[1] - center[1]) * (uv1[1] - center[1]) +
                     (uv1[0] - *center) * (uv1[0] - *center));
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
        *radius = dVar4;
        dVar5 = SQRT((uv2[1] - center[1]) * (uv2[1] - center[1]) +
                     (uv2[0] - *center) * (uv2[0] - *center));
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
        *radius = dVar4;
        return 0;
      }
      pcVar3 = "uv2";
      uVar2 = 0xf63;
    }
    else {
      pcVar3 = "uv1";
      uVar2 = 0xf61;
    }
  }
  else {
    pcVar3 = "uv0";
    uVar2 = 0xf5f;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar2,
         "ref_geom_tri_uv_bounding_sphere3",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_sphere3(REF_GEOM ref_geom,
                                                    REF_INT *nodes,
                                                    REF_DBL *center,
                                                    REF_DBL *radius) {
  REF_DBL uv0[2], uv1[2], uv2[2];
  REF_INT sens;

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_FACE, uv0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_FACE, uv1, &sens),
      "uv1");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[2], nodes, REF_GEOM_FACE, uv2, &sens),
      "uv2");

  center[0] = (uv0[0] + uv1[0] + uv2[0]) / 3.0;
  center[1] = (uv0[1] + uv1[1] + uv2[1]) / 3.0;

  *radius = 0.0;
  *radius = MAX(*radius,
                sqrt(pow(uv0[0] - center[0], 2) + pow(uv0[1] - center[1], 2)));
  *radius = MAX(*radius,
                sqrt(pow(uv1[0] - center[0], 2) + pow(uv1[1] - center[1], 2)));
  *radius = MAX(*radius,
                sqrt(pow(uv2[0] - center[0], 2) + pow(uv2[1] - center[1], 2)));

  return REF_SUCCESS;
}